

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               out,comm *comm)

{
  int iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_t local_size;
  int result;
  custom_op<unsigned_long,_true> op;
  allocator_type local_91;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  custom_op<unsigned_long,_true> local_70;
  
  if (comm->m_size == 1) {
    lVar10 = (long)end._M_current - (long)begin._M_current >> 3;
    if (0 < lVar10) {
      uVar11 = lVar10 + 1;
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&(out._M_current)->first + lVar10) =
             *(undefined8 *)((long)&(begin._M_current)->first + lVar10);
        uVar11 = uVar11 - 1;
        lVar10 = lVar10 + 8;
      } while (1 < uVar11);
    }
  }
  else {
    local_90 = (pointer)((long)end._M_current - (long)begin._M_current >> 3);
    custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
              ((custom_op<unsigned_long,true> *)&local_70);
    MPI_Allreduce(&local_90,&local_88,1,local_70.m_type_copy,local_70.m_op,comm->mpi_comm);
    puVar6 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    custom_op<unsigned_long,_true>::~custom_op(&local_70);
    if (puVar6 != (pointer)0x0) {
      local_70._vptr_custom_op._0_4_ = (uint)(local_90 == puVar6);
      MPI_Allreduce(&local_70,&local_88,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
      if ((int)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        uVar2 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_90,comm);
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
                   (long)comm->m_size,(value_type_conflict2 *)&local_88,&local_91);
        uVar7 = (ulong)comm->m_size;
        uVar11 = (ulong)puVar6 / uVar7;
        uVar4 = (ulong)puVar6 % uVar7;
        uVar5 = (uVar11 + 1) * uVar4;
        if (uVar2 < uVar5) {
          iVar1 = (int)(uVar2 / (uVar11 + 1));
        }
        else {
          iVar1 = (int)((uVar2 - uVar5) / uVar11) + (int)uVar4;
        }
        if ((local_90 != (pointer)0x0) && (iVar1 < comm->m_size)) {
          uVar3 = (ulong)iVar1;
          puVar6 = local_90;
          uVar5 = uVar3;
          do {
            uVar5 = uVar5 + 1;
            uVar3 = uVar3 + 1;
            uVar9 = uVar5;
            if (uVar4 < uVar5) {
              uVar9 = uVar4;
            }
            puVar8 = (pointer)((uVar11 * uVar3 - uVar2) + uVar9);
            if (puVar6 < puVar8) {
              puVar8 = puVar6;
            }
            *(pointer *)
             (CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) + -8 +
             uVar5 * 8) = puVar8;
            puVar6 = (pointer)((long)puVar6 - (long)puVar8);
          } while ((puVar6 != (pointer)0x0) &&
                  (uVar2 = uVar2 + (long)puVar8, (long)uVar5 < (long)uVar7));
        }
        all2all<unsigned_long>
                  (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,comm
                  );
        all2allv<std::pair<int,int>>
                  (begin._M_current,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,out._M_current
                   ,&local_88,comm);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) !=
            (void *)0x0) {
          operator_delete((void *)CONCAT44(local_70._vptr_custom_op._4_4_,
                                           (uint)local_70._vptr_custom_op));
        }
      }
      else {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (begin,end,out,(size_t)puVar6,comm);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    std::size_t local_size = std::distance(begin, end);
    std::size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        std::size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        std::vector<size_t> send_counts(comm.size(), 0);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        int first_p = part.target_processor(prefix);
        std::size_t left_to_send = local_size;
        for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
            std::size_t nsend = std::min<std::size_t>(part.prefix_size(first_p) - prefix, left_to_send);
            send_counts[first_p] = nsend;
            left_to_send -= nsend;
            prefix += nsend;
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
    }
}